

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACInfoWnd.cpp
# Opt level: O2

void ACIWnd::MoveAllVR(bool bIntoVR)

{
  LTImgWindow *pLVar1;
  WndMode WVar2;
  undefined7 in_register_00000039;
  list<ACIWnd_*,_std::allocator<ACIWnd_*>_> *plVar3;
  
  if ((int)CONCAT71(in_register_00000039,bIntoVR) == 0) {
    plVar3 = &listACIWnd_abi_cxx11_;
    while (plVar3 = (list<ACIWnd_*,_std::allocator<ACIWnd_*>_> *)
                    (((_List_base<ACIWnd_*,_std::allocator<ACIWnd_*>_> *)
                     &((_List_node_base *)plVar3)->_M_next)->_M_impl)._M_node.super__List_node_base.
                    _M_next, plVar3 != &listACIWnd_abi_cxx11_) {
      pLVar1 = *(LTImgWindow **)((long)plVar3 + 0x10);
      WVar2 = LTImgWindow::GetMode(pLVar1);
      if (WVar2 == WND_MODE_VR) {
        LTImgWindow::SetMode(pLVar1,WND_MODE_FLOAT);
      }
    }
  }
  else {
    plVar3 = &listACIWnd_abi_cxx11_;
    while (plVar3 = (list<ACIWnd_*,_std::allocator<ACIWnd_*>_> *)
                    (((_List_base<ACIWnd_*,_std::allocator<ACIWnd_*>_> *)
                     &((_List_node_base *)plVar3)->_M_next)->_M_impl)._M_node.super__List_node_base.
                    _M_next, plVar3 != &listACIWnd_abi_cxx11_) {
      pLVar1 = *(LTImgWindow **)((long)plVar3 + 0x10);
      WVar2 = LTImgWindow::GetMode(pLVar1);
      if (WVar2 == WND_MODE_FLOAT) {
        LTImgWindow::SetMode(pLVar1,WND_MODE_VR);
      }
    }
  }
  return;
}

Assistant:

void ACIWnd::MoveAllVR (bool bIntoVR)
{
    // move into VR
    if (bIntoVR) {
        for (ACIWnd* pWnd: listACIWnd) {
            if (pWnd->GetMode() == WND_MODE_FLOAT)
                pWnd->SetMode(WND_MODE_VR);
        }
    }
    // move out of VR
    else {
        for (ACIWnd* pWnd: listACIWnd) {
            if (pWnd->GetMode() == WND_MODE_VR)
                pWnd->SetMode(WND_MODE_FLOAT);
        }
    }
}